

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O3

thecl_t * th06_open(FILE *stream,uint version)

{
  ushort *puVar1;
  value_t *pvVar2;
  byte bVar3;
  ushort uVar4;
  long lVar5;
  int *piVar6;
  double dVar7;
  undefined4 uVar8;
  ushort uVar9;
  uint uVar10;
  size_t length;
  void *map;
  thecl_t *ptVar11;
  undefined8 *puVar12;
  char *pcVar13;
  thecl_instr_t *ptVar14;
  value_t *pvVar15;
  thecl_param_t *ptVar16;
  char *pcVar17;
  value_t *pvVar18;
  ulong uVar19;
  uint uVar20;
  list_node_t *plVar21;
  ulong uVar22;
  uint uVar23;
  code *value_from_data;
  long *plVar24;
  ushort *puVar25;
  int iVar26;
  uint *puVar27;
  uint *puVar28;
  list_node_t *list;
  list_node_t *old;
  list_t *plVar29;
  bool bVar30;
  char name [256];
  int local_1b0;
  ulong local_198;
  ulong local_178;
  char local_138 [264];
  
  length = file_fsize(stream);
  if ((length == 0xffffffffffffffff) || (map = file_mmap(stream,length), map == (void *)0x0)) {
    ptVar11 = (thecl_t *)0x0;
  }
  else {
    puVar1 = (ushort *)((long)map + (ulong)(7 < version) * 4);
    if (version == 6) {
      local_198 = 1;
      local_178 = 3;
    }
    else if (version == 9) {
      local_198 = (ulong)*(ushort *)((long)map + 6);
      local_178 = local_198;
    }
    else {
      local_198 = (ulong)puVar1[1];
      local_178 = 0x10;
    }
    ptVar11 = thecl_new();
    ptVar11->version = version;
    uVar4 = *puVar1;
    ptVar11->sub_count = (ulong)uVar4;
    if ((ulong)uVar4 != 0) {
      uVar22 = 0;
      do {
        puVar12 = (undefined8 *)calloc(1,0x60);
        sprintf(local_138,"Sub%zu",uVar22);
        pcVar13 = strdup(local_138);
        *puVar12 = pcVar13;
        puVar12[3] = 0;
        plVar29 = (list_t *)(puVar12 + 7);
        list_init(plVar29);
        list_init((list_t *)(puVar12 + 9));
        uVar20 = *(uint *)((long)map + (ulong)*(uint *)(puVar1 + (local_178 + uVar22) * 2 + 2));
        if (uVar20 != 0xffffffff) {
          puVar27 = (uint *)((ulong)*(uint *)(puVar1 + (local_178 + uVar22) * 2 + 2) + (long)map);
          uVar23 = 0;
          uVar4 = 0xff00;
          puVar28 = puVar27;
          do {
            if (*(short *)((long)puVar28 + 6) == 0) break;
            bVar30 = uVar20 != uVar23;
            iVar26 = (int)puVar28;
            local_1b0 = (int)puVar27;
            uVar23 = uVar20;
            if (bVar30) {
              ptVar14 = thecl_instr_time(uVar20);
              ptVar14->offset = iVar26 - local_1b0;
              list_append_new(plVar29,ptVar14);
              uVar23 = *puVar28;
            }
            if (uVar4 == (ushort)puVar28[2]) {
              uVar20 = iVar26 - local_1b0;
            }
            else {
              uVar10 = (uint)(ushort)((ushort)puVar28[2] >> 8);
              uVar20 = uVar10 | 0xf0;
              if ((version & 0xfffffffe) != 6) {
                uVar20 = uVar10;
              }
              ptVar14 = thecl_instr_rank(uVar20);
              uVar20 = iVar26 - local_1b0;
              ptVar14->offset = uVar20;
              list_append_new(plVar29,ptVar14);
              uVar4 = (ushort)puVar28[2];
            }
            ptVar14 = thecl_instr_new();
            uVar9 = (ushort)puVar28[1];
            ptVar14->id = (uint)uVar9;
            uVar19 = (ulong)*(ushort *)((long)puVar28 + 6);
            ptVar14->size = (uint)*(ushort *)((long)puVar28 + 6);
            ptVar14->offset = uVar20;
            ptVar14->address = uVar20 + *(int *)(puVar1 + (local_178 + uVar22) * 2 + 2);
            if (uVar9 == 0) {
              pcVar13 = "";
LAB_00116759:
              if (0xc < (ushort)uVar19) {
                value_from_data = th95_value_from_data;
                if ((version != 7) && (value_from_data = th95_value_from_data, version != 0x5f)) {
                  if (version == 8) {
                    value_from_data = th08_value_from_data;
                  }
                  else {
                    value_from_data = th06_value_from_data;
                  }
                }
                pvVar15 = value_list_from_data
                                    (value_from_data,(uchar *)(puVar28 + 3),uVar19 - 0xc,pcVar13);
                if (pvVar15->type != 0) {
                  uVar20 = (uint)*(ushort *)((long)puVar28 + 10);
                  pvVar18 = pvVar15;
                  do {
                    ptVar16 = param_new((int)*pcVar13);
                    uVar8 = *(undefined4 *)&pvVar18->field_0x4;
                    dVar7 = (pvVar18->val).d;
                    (ptVar16->value).type = pvVar18->type;
                    *(undefined4 *)&(ptVar16->value).field_0x4 = uVar8;
                    (ptVar16->value).val.d = dVar7;
                    (ptVar16->value).val.m.data = (pvVar18->val).m.data;
                    if ((version != 6) && ((uVar20 & 1) != 0)) {
                      ptVar16->stack = 1;
                    }
                    uVar20 = uVar20 >> 1;
                    list_append_new(&ptVar14->params,ptVar16);
                    pcVar13 = pcVar13 + 1;
                    pvVar2 = pvVar18 + 1;
                    pvVar18 = pvVar18 + 1;
                  } while (pvVar2->type != 0);
                }
                free(pvVar15);
              }
              list_append_new(plVar29,ptVar14);
            }
            else {
              pcVar13 = th06_find_format(version,(uint)uVar9,false);
              uVar19 = (ulong)*(ushort *)((long)puVar28 + 6);
              if (pcVar13 != (char *)0x0) goto LAB_00116759;
              fprintf(_stderr,"%-3d %04xB R%04x [%04x]: ",(ulong)(ushort)puVar28[1],uVar19,
                      (ulong)(ushort)puVar28[2],(ulong)*(ushort *)((long)puVar28 + 10));
              if (*(short *)((long)puVar28 + 6) != 0xc) {
                th06_open_cold_1();
              }
              fputc(10,_stderr);
            }
            uVar20 = *(uint *)((long)puVar28 + (ulong)*(ushort *)((long)puVar28 + 6));
            puVar28 = (uint *)((long)puVar28 + (ulong)*(ushort *)((long)puVar28 + 6));
          } while (uVar20 != 0xffffffff);
        }
        list_append_new(&ptVar11->subs,puVar12);
        uVar22 = uVar22 + 1;
      } while (uVar22 < *puVar1);
    }
    for (plVar21 = (ptVar11->subs).head; plVar21 != (list_node_t *)0x0; plVar21 = plVar21->next) {
      plVar24 = *(long **)((long)plVar21->data + 0x38);
      if (plVar24 != (long *)0x0) {
        list = (list_node_t *)((long)plVar21->data + 0x38);
        do {
          lVar5 = plVar24[2];
          for (puVar12 = *(undefined8 **)(lVar5 + 0x20); puVar12 != (undefined8 *)0x0;
              puVar12 = (undefined8 *)*puVar12) {
            if (*(int *)puVar12[2] == 0x6f) {
              uVar20 = *(int *)(lVar5 + 0x40) + ((int *)puVar12[2])[4];
              old = list;
              if (uVar20 == 0) {
                ptVar14 = thecl_instr_label(0);
                list_prepend_new((list_t *)list,ptVar14);
              }
              else {
                do {
                  old = old->next;
                  if (old == (list_node_t *)0x0) goto LAB_00116976;
                } while (*(int *)((long)old->data + 0x34) + *(int *)((long)old->data + 0x40) !=
                         uVar20);
                if (((old->next == (list_node_t *)0x0) ||
                    (piVar6 = (int *)old->next->data, piVar6 == (int *)0x0)) || (*piVar6 != 3)) {
                  ptVar14 = thecl_instr_label(uVar20);
                  list_append_to((list_t *)list,ptVar14,old);
                }
              }
            }
LAB_00116976:
          }
          plVar24 = (long *)*plVar24;
        } while (plVar24 != (long *)0x0);
      }
    }
    if (local_198 != 0) {
      uVar22 = 0;
LAB_001169c1:
      uVar4 = 0;
      sprintf(local_138,"Timeline%zu",uVar22);
      pcVar13 = (char *)malloc(0x110);
      strcpy(pcVar13,local_138);
      plVar29 = (list_t *)(pcVar13 + 0x100);
      list_init(plVar29);
      puVar25 = (ushort *)((ulong)*(uint *)(puVar1 + uVar22 * 2 + 2) + (long)map);
      bVar3 = (version < 8) - 1;
      do {
        uVar9 = *puVar25;
        if (version < 8) {
          if ((uVar9 == 0xffff) && (puVar25[1] == 4)) goto LAB_00116bac;
        }
        else if (((uVar9 == 0xffff) && (puVar25[1] == 0xffff)) && ((char)puVar25[3] == '\0'))
        goto LAB_00116bac;
        if (*(byte *)((long)puVar25 + 7) != bVar3) {
          ptVar14 = thecl_instr_rank((uint)*(byte *)((long)puVar25 + 7));
          list_append_new(plVar29,ptVar14);
          bVar3 = *(byte *)((long)puVar25 + 7);
          uVar9 = *puVar25;
        }
        if (uVar9 != uVar4) {
          ptVar14 = thecl_instr_time((uint)uVar9);
          list_append_new(plVar29,ptVar14);
          uVar4 = *puVar25;
        }
        ptVar14 = thecl_instr_new();
        ptVar14->size = (uint)(byte)puVar25[3];
        uVar9 = puVar25[2];
        ptVar14->id = (uint)uVar9;
        pcVar17 = th06_find_timeline_format(version,(uint)uVar9);
        if (pcVar17 == (char *)0x0) {
          th06_open_cold_2();
        }
        else {
          ptVar16 = param_new((int)*pcVar17);
          (ptVar16->value).val.u = puVar25[1];
          list_append_new(&ptVar14->params,ptVar16);
          if (8 < (ulong)(byte)puVar25[3]) {
            pvVar18 = value_list_from_data
                                (::value_from_data,(uchar *)(puVar25 + 4),
                                 (ulong)(byte)puVar25[3] - 8,pcVar17 + 1);
            iVar26 = pvVar18->type;
            pvVar15 = pvVar18;
            while (iVar26 != 0) {
              ptVar16 = param_new(iVar26);
              uVar8 = *(undefined4 *)&pvVar15->field_0x4;
              dVar7 = (pvVar15->val).d;
              (ptVar16->value).type = pvVar15->type;
              *(undefined4 *)&(ptVar16->value).field_0x4 = uVar8;
              (ptVar16->value).val.d = dVar7;
              (ptVar16->value).val.m.data = (pvVar15->val).m.data;
              list_append_new(&ptVar14->params,ptVar16);
              iVar26 = pvVar15[1].type;
              pvVar15 = pvVar15 + 1;
            }
            free(pvVar18);
          }
          list_append_new(plVar29,ptVar14);
        }
        puVar25 = (ushort *)((long)puVar25 + (ulong)(byte)puVar25[3]);
      } while( true );
    }
LAB_00116bce:
    file_munmap(map,length);
  }
  return ptVar11;
LAB_00116bac:
  list_append_new(&ptVar11->timelines,pcVar13);
  uVar22 = uVar22 + 1;
  if (uVar22 == local_198) goto LAB_00116bce;
  goto LAB_001169c1;
}

Assistant:

static thecl_t*
th06_open(
    FILE* stream,
    unsigned int version)
{
    long file_size;
    unsigned char* map;

    const th06_header_t* header;

    file_size = file_fsize(stream);
    if (file_size == -1)
        return NULL;

    map = file_mmap(stream, file_size);
    if (!map)
        return NULL;

    /* TODO: Check magic. */
    if (version >= 8)
        header = (th06_header_t*)(map + sizeof(uint32_t));
    else
        header = (th06_header_t*)map;

    size_t timeline_count;
    size_t timeline_count_max;
    if (version == 9) {
        timeline_count = header->timeline_count;
        timeline_count_max = header->timeline_count;
    } else if (version == 6) {
        timeline_count = 1;
        timeline_count_max = 3;
    } else {
        timeline_count = header->timeline_count;
        timeline_count_max = 16;
    }

    thecl_t* ecl = thecl_new();
    ecl->version = version;
    ecl->sub_count = header->sub_count;

    for (size_t s = 0; s < header->sub_count; ++s) {
        unsigned int rank = 0xff << 8;
        char name[256];
        thecl_sub_t* sub = malloc(sizeof(*sub));
        memset(sub, 0, sizeof(*sub));
        sprintf(name, "Sub%zu", s);
        sub->name = strdup(name);
        sub->format = NULL;
        list_init(&sub->instrs);
        list_init(&sub->labels);
        unsigned int time = 0;

        const void* raw_sub = map + header->offsets[timeline_count_max + s];
        const th06_instr_t* raw_instr = (th06_instr_t*)(raw_sub);
        while (raw_instr->time != 0xffffffff && raw_instr->size) {
            if (raw_instr->time != time) {
                thecl_instr_t* new = thecl_instr_time(raw_instr->time);
                new->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
                list_append_new(&sub->instrs, new);
                time = raw_instr->time;
            }

            if (raw_instr->rank_mask != rank) {
                uint16_t rank_mask = raw_instr->rank_mask >> 8;
                if (version == 6 || version == 7)
                    rank_mask |= 0xf0;
                thecl_instr_t* new = thecl_instr_rank(rank_mask & 0xff);
                new->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
                list_append_new(&sub->instrs, new);
                rank = raw_instr->rank_mask;
            }

            thecl_instr_t* instr = thecl_instr_new();
            instr->id = raw_instr->id;
            instr->size = raw_instr->size;
            instr->offset = (ptrdiff_t)raw_instr - (ptrdiff_t)raw_sub;
            instr->address = instr->offset + header->offsets[timeline_count_max + s];

            const char* format;

            if (raw_instr->id == 0)
                format = "";
            else
                format = th06_find_format(version, raw_instr->id, 0);

            if (!format) {
                fprintf(stderr, "%-3d %04xB R%04x [%04x]: ",
                    raw_instr->id,
                    raw_instr->size,
                    raw_instr->rank_mask,
                    raw_instr->param_mask
                );

                for (size_t d = 0; d < raw_instr->size - sizeof(th06_instr_t); d += 4) {
                    fprintf(stderr, " %08x (%d, %f)",
                        *(uint32_t*)(raw_instr->data + d),
                        *(int32_t*)(raw_instr->data + d),
                        *(float*)(raw_instr->data + d)
                        );
                }

                fprintf(stderr, "\n");
                goto next;
            }

            if (raw_instr->size > sizeof(th06_instr_t)) {
                value_t* values;
                if (version == 7 || version == 95)
                    values = value_list_from_data(th95_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                else if (version == 8)
                    values = value_list_from_data(th08_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                else
                    values = value_list_from_data(th06_value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_instr_t), format);
                value_t* value_iter = values;
                uint16_t param_mask = raw_instr->param_mask;

                size_t p = 0;
                char f;
                while (value_iter->type) {
                    f = format[p];
                    thecl_param_t* param = param_new(f);
                    param->value = *value_iter;
                    if (version != 6 && param_mask & 1)
                        param->stack = 1;
                    param_mask >>= 1;
                    ++value_iter;
                    ++p;
                    list_append_new(&instr->params, param);
                }
                free(values);
            }

            list_append_new(&sub->instrs, instr);

next:
            raw_instr = (th06_instr_t*)((char*)raw_instr + raw_instr->size);
        }

        list_append_new(&ecl->subs, sub);
    }

    th06_insert_labels(ecl);

    thecl_timeline_t* timeline;

    for (size_t e = 0; e < timeline_count; ++e) {
        char name[128];
        sprintf(name, "Timeline%zu", e);

        timeline = malloc(sizeof(*timeline));
        strcpy(timeline->name, name);
        list_init(&timeline->instrs);

        uint16_t time = 0;
        uint8_t rank = version >= 8 ? 0xff : 0x00;
        th06_timeline_instr_t* raw_instr = (th06_timeline_instr_t*)(map + header->offsets[e]);
        while(!th06_check_timeline_sentinel(version, raw_instr)) {
            if (raw_instr->rank != rank) {
                thecl_instr_t* new = thecl_instr_rank(raw_instr->rank);
                list_append_new(&timeline->instrs, new);
                rank = raw_instr->rank;
            }
            if (raw_instr->time != time) {
                thecl_instr_t* new = thecl_instr_time(raw_instr->time);
                list_append_new(&timeline->instrs, new);
                time = raw_instr->time;
            }

            thecl_instr_t* instr = thecl_instr_new();
            instr->size = raw_instr->size;
            instr->id = raw_instr->id;

            const char* format = th06_find_timeline_format(version, raw_instr->id);

            if (!format) {
                fprintf(stderr, "%-3d %04xB: ",
                    raw_instr->id,
                    raw_instr->size
                    );

                for (size_t d = 0; d < raw_instr->size - sizeof(th06_timeline_instr_t); d += 4) {
                    fprintf(stderr, " %08x (%d, %f)",
                        *(uint32_t*)(raw_instr->data + d),
                        *(int32_t*)(raw_instr->data + d),
                        *(float*)(raw_instr->data + d)
                        );
                }

                fprintf(stderr, "\n");
            } else {
                thecl_param_t* param0 = param_new(format[0]);
                param0->value.val.s = raw_instr->arg0;
                list_append_new(&instr->params, param0);

                if (raw_instr->size > sizeof(th06_timeline_instr_t)) {
                    /* The first parameter is in the struct and is always s, so it needs to be ignored here. */
                    value_t* values = value_list_from_data(value_from_data, raw_instr->data, raw_instr->size - sizeof(th06_timeline_instr_t), format + 1);
                    value_t* value_iter = values;
                    while (value_iter->type) {
                        thecl_param_t* param = param_new(value_iter->type);
                        param->value = *value_iter;
                        ++value_iter;
                        list_append_new(&instr->params, param);
                    }
                    free(values);
                }

                list_append_new(&timeline->instrs, instr);
            }

            raw_instr = (th06_timeline_instr_t*)((char*)raw_instr + raw_instr->size);
        }

        list_append_new(&ecl->timelines, timeline);
    }

    file_munmap(map, file_size);

    return ecl;
}